

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_palette.c
# Opt level: O2

bool_t prf_color_palette_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort uVar1;
  uint8_t *buffer;
  uint uVar2;
  bool_t bVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ushort *puVar7;
  
  if (node->opcode == prf_color_palette_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    uVar2 = (uint)node->length;
    if (node->length < 0x84) {
      uVar6 = 4;
    }
    else {
      buffer = node->data;
      bf_write(bfile,buffer,0x80);
      uVar5 = 0x400;
      if (node->length < 0x1088) {
        uVar5 = (uint)((short)(node->length - 0x84) / 4);
      }
      for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        bf_put_uint32_be(bfile,*(uint32_t *)(buffer + uVar4 * 4 + 0x80));
      }
      uVar2 = (uint)node->length;
      uVar6 = uVar5 * 4 + 0x88;
      if (node->length < uVar6) {
        uVar6 = uVar5 * 4 + 0x84;
      }
      else {
        bf_put_uint32_be(bfile,*(uint32_t *)(buffer + 0x1080));
        puVar7 = (ushort *)(node->data + ((ulong)uVar6 - 4));
        uVar5 = 0;
        for (; (uVar2 = (uint)node->length, uVar5 < *(uint *)(buffer + 0x1080) &&
               (uVar6 + *puVar7 <= uVar2)); uVar6 = uVar6 + uVar1) {
          bf_put_uint16_be(bfile,*puVar7);
          bf_put_uint16_be(bfile,puVar7[1]);
          bf_put_uint16_be(bfile,puVar7[2]);
          bf_put_uint16_be(bfile,puVar7[3]);
          bf_write(bfile,(uint8_t *)(puVar7 + 4),*puVar7 - 8);
          uVar1 = *puVar7;
          puVar7 = (ushort *)((long)puVar7 + (ulong)uVar1);
          uVar5 = uVar5 + 1;
        }
      }
    }
    bVar3 = 1;
    if (uVar2 - uVar6 != 0 && (int)uVar6 <= (int)uVar2) {
      bf_write(bfile,node->data + (long)(int)uVar6 + -4,uVar2 - uVar6);
    }
  }
  else {
    bVar3 = 0;
    prf_error(3,"tried color palette save method on other node");
  }
  return bVar3;
}

Assistant:

static
bool_t
prf_color_palette_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_color_palette_info.opcode ) {
        prf_error( 3, "tried color palette save method on other node" );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        unsigned int num, i;
        uint8_t * ptr;
        if ( node->length < (pos + 128) ) break;
        data = (node_data *) node->data;
        bf_write( bfile, (uint8_t *) data->reserved1, 128 ); pos += 128;
        num = PRF_MIN( 1024, ((node->length - 132) / 4) );
        for ( i = 0; i < num; i++ ) {
            bf_put_uint32_be( bfile, data->brightest_rgb[i] ); pos += 4;
        }
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->num_color_names ); pos += 4;
        ptr = node->data + pos - 4;

        for ( i = 0; i < data->num_color_names; i++ ) {
            struct prf_color_name_data * cdata;
            cdata = (struct prf_color_name_data *) ptr;
            if ( node->length < (pos + cdata->length) ) break;
            bf_put_uint16_be( bfile, cdata->length );
            bf_put_uint16_be( bfile, cdata->reserved1 );
            bf_put_uint16_be( bfile, cdata->index );
            bf_put_uint16_be( bfile, cdata->reserved2 );
            bf_write( bfile, (uint8_t *) cdata->name, cdata->length - 8 );
            pos += cdata->length;
            ptr += cdata->length;
        }

    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}